

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

void __thiscall
chrono::ChArchiveOut::out<chrono::geometry::ChTriangle>
          (ChArchiveOut *this,
          ChNameValue<std::vector<chrono::geometry::ChTriangle,_std::allocator<chrono::geometry::ChTriangle>_>_>
          *bVal)

{
  ulong uVar1;
  long lVar2;
  size_t i;
  ulong uVar3;
  ChNameValue<chrono::geometry::ChTriangle> local_98;
  ChValueSpecific<std::vector<chrono::geometry::ChTriangle,_std::allocator<chrono::geometry::ChTriangle>_>_>
  specVal;
  char buffer [20];
  
  ChValueSpecific<std::vector<chrono::geometry::ChTriangle,_std::allocator<chrono::geometry::ChTriangle>_>_>
  ::ChValueSpecific(&specVal,bVal->_value,bVal->_name,bVal->_flags);
  (*(this->super_ChArchive)._vptr_ChArchive[0xe])
            (this,&specVal,
             ((long)(bVal->_value->
                    super__Vector_base<chrono::geometry::ChTriangle,_std::allocator<chrono::geometry::ChTriangle>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(bVal->_value->
                   super__Vector_base<chrono::geometry::ChTriangle,_std::allocator<chrono::geometry::ChTriangle>_>
                   )._M_impl.super__Vector_impl_data._M_start) / 0x50);
  lVar2 = 0;
  uVar3 = 0;
  while( true ) {
    uVar1 = ((long)(bVal->_value->
                   super__Vector_base<chrono::geometry::ChTriangle,_std::allocator<chrono::geometry::ChTriangle>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
            (long)(bVal->_value->
                  super__Vector_base<chrono::geometry::ChTriangle,_std::allocator<chrono::geometry::ChTriangle>_>
                  )._M_impl.super__Vector_impl_data._M_start) / 0x50;
    if (uVar1 <= uVar3) break;
    sprintf(buffer,"%lu",uVar3);
    local_98._value =
         (ChTriangle *)
         ((long)(((bVal->_value->
                  super__Vector_base<chrono::geometry::ChTriangle,_std::allocator<chrono::geometry::ChTriangle>_>
                  )._M_impl.super__Vector_impl_data._M_start)->p1).m_data + lVar2 + -8);
    local_98._flags = '\0';
    local_98._name = buffer;
    out<chrono::geometry::ChTriangle>(this,&local_98);
    (*(this->super_ChArchive)._vptr_ChArchive[0xf])
              (this,&specVal,
               ((long)(bVal->_value->
                      super__Vector_base<chrono::geometry::ChTriangle,_std::allocator<chrono::geometry::ChTriangle>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
               (long)(bVal->_value->
                     super__Vector_base<chrono::geometry::ChTriangle,_std::allocator<chrono::geometry::ChTriangle>_>
                     )._M_impl.super__Vector_impl_data._M_start) / 0x50);
    uVar3 = uVar3 + 1;
    lVar2 = lVar2 + 0x50;
  }
  (*(this->super_ChArchive)._vptr_ChArchive[0x10])(this,&specVal,uVar1);
  ChValue::~ChValue(&specVal.super_ChValue);
  return;
}

Assistant:

void out     (ChNameValue< std::vector<T> > bVal) {
          ChValueSpecific< std::vector<T> > specVal(bVal.value(), bVal.name(), bVal.flags());
          this->out_array_pre( specVal, bVal.value().size());
          for (size_t i = 0; i<bVal.value().size(); ++i)
          {
              char buffer[20];
              sprintf(buffer, "%lu", (unsigned long)i);
              ChNameValue< T > array_val(buffer, bVal.value()[i]);
              this->out (array_val);
              this->out_array_between(specVal, bVal.value().size());
          }
          this->out_array_end(specVal, bVal.value().size());
      }